

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplesUtil.cpp
# Opt level: O0

int64_t aeron::archive::findLatestRecordingId
                  (AeronArchive *archive,string *channel,int32_t streamId)

{
  int32_t iVar1;
  ostream *poVar2;
  RecordingDescriptorConsumer local_58;
  int local_34;
  anon_class_8_1_800f6c56 aStack_30;
  int32_t foundCount;
  anon_class_8_1_800f6c56 consumer;
  int64_t lastRecordingId;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *archive_local;
  
  consumer.lastRecordingId = (int64_t *)0xffffffffffffffff;
  aStack_30.lastRecordingId = (int64_t *)&consumer;
  std::
  function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
  ::
  function<aeron::archive::findLatestRecordingId(aeron::archive::AeronArchive&,std::__cxx11::string_const&,int)::__0&,void>
            ((function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
              *)&local_58,&stack0xffffffffffffffd0);
  iVar1 = AeronArchive::listRecordingsForUri(archive,0,100,channel,streamId,&local_58);
  std::
  function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  if (iVar1 != 0) {
    local_34 = iVar1;
    poVar2 = std::operator<<((ostream *)&std::cout,"found ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
    poVar2 = std::operator<<(poVar2,", last recording id = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)consumer.lastRecordingId);
    std::operator<<(poVar2,'\n');
  }
  return (int64_t)consumer.lastRecordingId;
}

Assistant:

std::int64_t findLatestRecordingId(aeron::archive::AeronArchive& archive, const std::string& channel,
                                   std::int32_t streamId) {
    std::int64_t lastRecordingId{-1};

    auto consumer = [&](long controlSessionId, long correlationId, long recordingId, long startTimestamp,
                        long stopTimestamp, long startPosition, long stopPosition, int initialTermId,
                        int segmentFileLength, int termBufferLength, int mtuLength, int sessionId, int streamId,
                        const std::string& strippedChannel, const std::string& originalChannel,
                        const std::string& sourceIdentity) {
        std::cout << "recId: " << recordingId << ", ts: [" << startTimestamp << ", " << stopTimestamp
                  << "], pos: [" << startPosition << ", " << stopPosition
                  << "], initialTermId: " << initialTermId << ", sessionId: " << sessionId << ", streamId: " << streamId
                  << ", strippedChannel: " << strippedChannel << ", originalChannel: " << originalChannel
                  << ", sourceIdentity: " << sourceIdentity << '\n';

        lastRecordingId = recordingId;
    };

    std::int32_t foundCount = archive.listRecordingsForUri(0, 100, channel, streamId, consumer);

    if (foundCount) {
        std::cout << "found " << foundCount << ", last recording id = " << lastRecordingId << '\n';
    }

    return lastRecordingId;
}